

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

void __thiscall BigNumber::BigNumber(BigNumber *this,int64_t num)

{
  __type_conflict _Var1;
  char local_31;
  int local_30;
  digit_t digit;
  int i;
  int local_1c;
  long lStack_18;
  int len;
  int64_t num_local;
  BigNumber *this_local;
  
  this->_vptr_BigNumber = (_func_int **)&PTR__BigNumber_004bd1c8;
  lStack_18 = num;
  num_local = (int64_t)this;
  std::vector<char,_std::allocator<char>_>::vector(&this->m_digits);
  if (lStack_18 < 0) {
    this->m_symbol = NEGATIVE;
    lStack_18 = -lStack_18;
  }
  else {
    this->m_symbol = POSITIVE;
  }
  local_1c = 1;
  if (lStack_18 != 0) {
    _Var1 = std::log10<long>(lStack_18);
    local_1c = (int)(_Var1 + 1.0);
  }
  for (local_30 = 0; local_30 < local_1c; local_30 = local_30 + 1) {
    local_31 = (char)lStack_18 +
               ((char)(SUB168(SEXT816(lStack_18) * SEXT816(0x6666666666666667),8) >> 2) -
               (SUB161(SEXT816(lStack_18) * SEXT816(0x6666666666666667),0xf) >> 7)) * -10;
    lStack_18 = lStack_18 / 10;
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_digits,&local_31);
  }
  if (1 < local_1c) {
    trim(this);
  }
  return;
}

Assistant:

BigNumber::BigNumber(int64_t num)
{
    if (num<0)
    {
        m_symbol = NEGATIVE;
        num=-num;
    }
    else
        m_symbol = POSITIVE;
    int len = 1;
    if(num!=0)
        len=log10(num)+1;
    for (int i =0; i<len; ++i)
    {
        digit_t digit;
        digit=num%10;
        num=num/10;
        m_digits.push_back(digit);
    }
    if(len>1) {
        trim();
    }
}